

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::Matrix::createIdentity(int size)

{
  double **extraout_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  Matrix MVar1;
  int j;
  int i;
  Matrix *temp;
  int in_stack_ffffffffffffffe8;
  int iVar2;
  int in_stack_ffffffffffffffec;
  int iVar3;
  uint3 in_stack_fffffffffffffff0;
  
  Matrix((Matrix *)CONCAT44(in_ESI,(uint)in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
         in_stack_ffffffffffffffe8);
  for (iVar3 = 0; iVar3 < *in_RDI; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < in_RDI[1]; iVar2 = iVar2 + 1) {
      if (iVar3 == iVar2) {
        *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + (long)iVar3 * 8) + (long)iVar2 * 8) =
             0x3ff0000000000000;
      }
      else {
        *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + (long)iVar3 * 8) + (long)iVar2 * 8) = 0;
      }
    }
  }
  MVar1.p = extraout_RDX;
  MVar1._0_8_ = in_RDI;
  return MVar1;
}

Assistant:

Matrix Matrix::createIdentity(int size)
{
    Matrix temp(size, size);
    for (int i = 0; i < temp.rows_; ++i) {
        for (int j = 0; j < temp.cols_; ++j) {
            if (i == j) {
                temp.p[i][j] = 1;
            } else {
                temp.p[i][j] = 0;
            }
        }
    }
    return temp;
}